

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGeneratorInitializer.cxx
# Opt level: O2

void AddGeneratedSource(cmMakefile *makefile,string *filename,GeneratorType genType)

{
  cmSourceFile *this;
  cmState *pcVar1;
  char *pcVar2;
  char *pcVar3;
  cmSourceGroup *this_00;
  char *pcVar4;
  string local_88;
  allocator local_62;
  allocator local_61;
  string local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  folders;
  
  this = cmMakefile::GetOrCreateSource(makefile,filename,true);
  std::__cxx11::string::string((string *)&local_88,"GENERATED",(allocator *)&local_60);
  cmSourceFile::SetProperty(this,&local_88,"1");
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string((string *)&local_88,"SKIP_AUTOGEN",(allocator *)&local_60);
  cmSourceFile::SetProperty(this,&local_88,"On");
  std::__cxx11::string::~string((string *)&local_88);
  if (genType == RCC) {
    pcVar1 = cmMakefile::GetState(makefile);
    std::__cxx11::string::string((string *)&local_88,"AUTORCC_SOURCE_GROUP",(allocator *)&local_60);
    pcVar2 = cmState::GetGlobalProperty(pcVar1,&local_88);
LAB_00387fea:
    std::__cxx11::string::~string((string *)&local_88);
    if ((pcVar2 != (char *)0x0) && (*pcVar2 != '\0')) goto LAB_00388048;
  }
  else if (genType == MOC) {
    pcVar1 = cmMakefile::GetState(makefile);
    std::__cxx11::string::string((string *)&local_88,"AUTOMOC_SOURCE_GROUP",(allocator *)&local_60);
    pcVar2 = cmState::GetGlobalProperty(pcVar1,&local_88);
    goto LAB_00387fea;
  }
  pcVar1 = cmMakefile::GetState(makefile);
  std::__cxx11::string::string((string *)&local_88,"AUTOGEN_SOURCE_GROUP",(allocator *)&local_60);
  pcVar2 = cmState::GetGlobalProperty(pcVar1,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  if (pcVar2 == (char *)0x0) {
    return;
  }
  if (*pcVar2 == '\0') {
    return;
  }
LAB_00388048:
  std::__cxx11::string::string((string *)&local_88,"SOURCE_GROUP_DELIMITER",(allocator *)&local_60);
  pcVar3 = cmMakefile::GetDefinition(makefile,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string((string *)&local_88,pcVar2,&local_61);
  pcVar4 = "\\";
  if (pcVar3 != (char *)0x0) {
    pcVar4 = pcVar3;
  }
  std::__cxx11::string::string((string *)&local_60,pcVar4,&local_62);
  cmSystemTools::tokenize(&folders,&local_88,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_88);
  this_00 = cmMakefile::GetSourceGroup(makefile,&folders);
  if (this_00 == (cmSourceGroup *)0x0) {
    cmMakefile::AddSourceGroup(makefile,&folders,(char *)0x0);
    this_00 = cmMakefile::GetSourceGroup(makefile,&folders);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&folders);
  if (this_00 == (cmSourceGroup *)0x0) {
    std::__cxx11::string::string((string *)&local_60,pcVar2,(allocator *)&folders);
    cmQtAutoGeneratorCommon::Quoted(&local_88,&local_60);
    cmSystemTools::Error
              ("Autogen: Could not create or find source group: ",local_88._M_dataplus._M_p,
               (char *)0x0,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_60);
  }
  else {
    cmSourceGroup::AddGroupFile(this_00,filename);
  }
  return;
}

Assistant:

static void AddGeneratedSource(cmMakefile* makefile,
                               const std::string& filename,
                               cmQtAutoGeneratorCommon::GeneratorType genType)
{
  cmSourceFile* gFile = makefile->GetOrCreateSource(filename, true);
  gFile->SetProperty("GENERATED", "1");
  gFile->SetProperty("SKIP_AUTOGEN", "On");

  AddToSourceGroup(makefile, filename, genType);
}